

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

LogicalType *
duckdb::DecimalSizeCheck(LogicalType *__return_storage_ptr__,LogicalType *left,LogicalType *right)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  LogicalType *pLVar4;
  LogicalType *extraout_RAX;
  InternalException *this;
  uint8_t other_width;
  uint8_t other_scale;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  uint8_t in_stack_ffffffffffffffad;
  byte in_stack_ffffffffffffffae;
  uint8_t local_51;
  string local_50;
  
  do {
    pLVar4 = right;
    right = left;
    left = pLVar4;
  } while (right->id_ == DECIMAL);
  local_50._M_dataplus._M_p =
       (pointer)(pLVar4->type_info_).internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
            ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_50);
  bVar1 = *(byte *)&((element_type *)(local_50._M_dataplus._M_p + 0x38))->_vptr_ExtraTypeInfo;
  local_50._M_dataplus._M_p =
       (pointer)(pLVar4->type_info_).internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid
            ((optional_ptr<duckdb::ExtraTypeInfo,_true> *)&local_50);
  bVar2 = local_50._M_dataplus._M_p[0x39];
  bVar3 = LogicalType::GetDecimalProperties(right,&stack0xffffffffffffffae,&local_51);
  if (bVar3) {
    if ((int)((uint)bVar1 - (uint)bVar2) < (int)(uint)in_stack_ffffffffffffffae) {
      NumericCastImpl<unsigned_char,_int,_false>::Convert
                ((uint)in_stack_ffffffffffffffae + (uint)bVar2);
      pLVar4 = LogicalType::DECIMAL(in_stack_ffffffffffffffae,in_stack_ffffffffffffffad);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,pLVar4);
      pLVar4 = extraout_RAX;
    }
    return pLVar4;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Type provided to DecimalSizeCheck was not a numeric type","");
  InternalException::InternalException(this,&local_50);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static LogicalType DecimalSizeCheck(const LogicalType &left, const LogicalType &right) {
	D_ASSERT(left.id() == LogicalTypeId::DECIMAL || right.id() == LogicalTypeId::DECIMAL);
	D_ASSERT(left.id() != right.id());

	//! Make sure the 'right' is the DECIMAL type
	if (left.id() == LogicalTypeId::DECIMAL) {
		return DecimalSizeCheck(right, left);
	}
	auto width = DecimalType::GetWidth(right);
	auto scale = DecimalType::GetScale(right);

	uint8_t other_width;
	uint8_t other_scale;
	bool success = left.GetDecimalProperties(other_width, other_scale);
	if (!success) {
		throw InternalException("Type provided to DecimalSizeCheck was not a numeric type");
	}
	D_ASSERT(other_scale == 0);
	const auto effective_width = width - scale;
	if (other_width > effective_width) {
		auto new_width = NumericCast<uint8_t>(other_width + scale);
		//! Cap the width at max, if an actual value exceeds this, an exception will be thrown later
		if (new_width > DecimalType::MaxWidth()) {
			new_width = DecimalType::MaxWidth();
		}
		return LogicalType::DECIMAL(new_width, scale);
	}
	return right;
}